

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O0

bool __thiscall
ON_AerialPhotoImage::SetImageSize
          (ON_AerialPhotoImage *this,int image_width_pixels,int image_height_pixels)

{
  bool local_19;
  bool rc;
  int image_height_pixels_local;
  int image_width_pixels_local;
  ON_AerialPhotoImage *this_local;
  
  local_19 = false;
  if ((image_width_pixels < 1) || (image_height_pixels < 1)) {
    UnsetImageSize(this);
  }
  else {
    this->m_image_width_pixels = image_width_pixels;
    this->m_image_height_pixels = image_height_pixels;
    local_19 = true;
  }
  return local_19;
}

Assistant:

bool ON_AerialPhotoImage::SetImageSize(
  int image_width_pixels,
  int image_height_pixels
  )
{
  bool rc = false;
  if ( image_width_pixels > 0 && image_height_pixels > 0 )
  {
    m_image_width_pixels = image_width_pixels;
    m_image_height_pixels = image_height_pixels;
    rc = true;
  }
  else
    UnsetImageSize();

  return rc;
}